

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Stream::uploadDeviceDestroyed(QHttp2Stream *this)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QLatin1StringView message;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined8 local_48;
  QArrayData *local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x38) != 0) {
    message.m_data = "Upload device destroyed while uploading";
    message.m_size = 0x27;
    streamError(this,CANCEL,message);
    QVar1.m_data = (storage_type *)0x27;
    QVar1.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar1);
    local_58 = local_38;
    puStack_50 = puStack_30;
    local_48 = local_28;
    local_38 = (QArrayData *)0x0;
    puStack_30 = (undefined1 *)&local_58;
    QMetaObject::activate((QObject *)this,&staticMetaObject,9,&local_38);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  *(undefined8 *)(this + 0x30) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::uploadDeviceDestroyed()
{
    if (isUploadingDATA()) {
        // We're in the middle of sending DATA frames, we need to abort
        // the stream.
        streamError(CANCEL, QLatin1String("Upload device destroyed while uploading"));
        emit uploadDeviceError("Upload device destroyed while uploading"_L1);
    }
    m_uploadDevice = nullptr;
}